

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

int tjCompress(tjhandle handle,uchar *srcBuf,int width,int pitch,int height,int pixelSize,
              uchar *jpegBuf,unsigned_long *jpegSize,int jpegSubsamp,int jpegQual,int flags)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  uchar *in_RDI;
  undefined4 in_R8D;
  int in_R9D;
  unsigned_long *in_stack_00000010;
  uint in_stack_00000028;
  unsigned_long size;
  int retval;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined8 in_stack_ffffffffffffff80;
  uchar *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  unsigned_long in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  undefined4 local_34;
  
  if ((in_stack_00000028 & 0x200) == 0) {
    getPixelFormat(in_R9D,in_stack_00000028);
    local_34 = tjCompress2((tjhandle)CONCAT44(in_R8D,in_ECX),
                           (uchar *)CONCAT44(in_EDX,in_stack_ffffffffffffff90),
                           (int)((ulong)in_RSI >> 0x20),(int)in_RSI,(int)((ulong)in_RDI >> 0x20),
                           (int)in_RDI,
                           (uchar **)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                           (unsigned_long *)
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           (int)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8,in_R9D);
  }
  else {
    in_stack_ffffffffffffffc0 =
         tjBufSizeYUV((int)((ulong)in_stack_ffffffffffffff60 >> 0x20),(int)in_stack_ffffffffffffff60
                      ,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    getPixelFormat(in_R9D,in_stack_00000028);
    local_34 = tjEncodeYUV2((tjhandle)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            in_stack_ffffffffffffff88,
                            (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                            (int)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                            in_stack_ffffffffffffff78,in_RDI,(int)in_RSI,in_stack_ffffffffffffffb0);
  }
  *in_stack_00000010 = in_stack_ffffffffffffffc0;
  return local_34;
}

Assistant:

DLLEXPORT int tjCompress(tjhandle handle, unsigned char *srcBuf, int width,
                         int pitch, int height, int pixelSize,
                         unsigned char *jpegBuf, unsigned long *jpegSize,
                         int jpegSubsamp, int jpegQual, int flags)
{
  int retval = 0;
  unsigned long size;

  if (flags & TJ_YUV) {
    size = tjBufSizeYUV(width, height, jpegSubsamp);
    retval = tjEncodeYUV2(handle, srcBuf, width, pitch, height,
                          getPixelFormat(pixelSize, flags), jpegBuf,
                          jpegSubsamp, flags);
  } else {
    retval = tjCompress2(handle, srcBuf, width, pitch, height,
                         getPixelFormat(pixelSize, flags), &jpegBuf, &size,
                         jpegSubsamp, jpegQual, flags | TJFLAG_NOREALLOC);
  }
  *jpegSize = size;
  return retval;
}